

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86::forward(Convolution1D_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  int iVar4;
  _func_int *p_Var5;
  _func_int **pp_Var6;
  _func_int **pp_Var7;
  void *pvVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int *piVar17;
  long lVar18;
  void *pvVar19;
  int iVar20;
  uint _h;
  long lVar21;
  int iVar22;
  ulong uVar23;
  int iVar24;
  int iVar25;
  float *pfVar26;
  ulong uVar27;
  float *pfVar28;
  uint _elempack;
  undefined1 (*pauVar29) [16];
  float *pfVar30;
  ulong uVar31;
  ulong uVar32;
  float *pfVar33;
  long lVar34;
  bool bVar35;
  undefined1 auVar36 [12];
  float fVar38;
  float fVar39;
  float fVar40;
  v4sf one;
  float fVar41;
  float fVar42;
  float fVar55;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar56 [12];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  ulong local_120;
  Mat local_c8;
  undefined1 local_78 [16];
  ulong local_60;
  long local_58;
  void *local_50;
  long local_48;
  void *local_40;
  ulong local_38;
  undefined1 auVar37 [16];
  
  uVar31 = bottom_blob->elemsize;
  uVar3 = bottom_blob->elempack;
  p_Var5 = this->_vptr_Convolution1D_x86[-3];
  iVar4 = *(int *)(&this->field_0xd4 + (long)p_Var5);
  iVar25 = *(int *)(&this->field_0xd8 + (long)p_Var5);
  local_c8.cstep = 0;
  local_c8.data = (void *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize._0_4_ = 0;
  local_c8.elemsize._4_4_ = 0;
  local_c8.elempack = 0;
  local_c8.allocator = (Allocator *)0x0;
  local_c8.dims = 0;
  local_c8.w = 0;
  local_c8.h = 0;
  local_c8.d = 0;
  local_c8.c = 0;
  Convolution1D::make_padding
            ((Convolution1D *)
             ((long)&this->_vptr_Convolution1D_x86 + (long)this->_vptr_Convolution1D_x86[-3]),
             bottom_blob,&local_c8,opt);
  iVar20 = local_c8.h;
  iVar24 = -100;
  if ((local_c8.data != (void *)0x0) && ((long)local_c8.c * local_c8.cstep != 0)) {
    _elempack = 1;
    if (opt->use_packing_layout == true) {
      _elempack = (uint)(((&this->field_0xd0)[(long)this->_vptr_Convolution1D_x86[-3]] & 3) == 0) *
                  3 + 1;
    }
    uVar32 = (ulong)(uint)local_c8.h;
    iVar4 = (local_c8.w + ~((iVar4 + -1) * iVar25)) /
            *(int *)(&this->field_0xdc + (long)this->_vptr_Convolution1D_x86[-3]);
    local_60 = (ulong)(iVar4 + 1U);
    _h = *(int *)(&this->field_0xd0 + (long)this->_vptr_Convolution1D_x86[-3]) / (int)_elempack;
    Mat::create(top_blob,iVar4 + 1U,_h,(ulong)_elempack * (uVar31 / (ulong)(long)(int)uVar3),
                _elempack,opt->blob_allocator);
    auVar37 = _DAT_0054dea0;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      if (((_elempack ^ 4) == 0 && uVar3 == 4) && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_120 = 0;
        fVar38 = (float)DAT_0054dea0;
        fVar39 = DAT_0054dea0._4_4_;
        fVar40 = DAT_0054dea0._8_4_;
        fVar41 = DAT_0054dea0._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar29 = (undefined1 (*) [16])
                       ((long)top_blob->w * local_120 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar24 = 0;
            iVar25 = 0;
            do {
              auVar48 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar74 = ZEXT816(0);
              }
              else {
                auVar74 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + local_120 * 0x10);
              }
              if (0 < iVar20) {
                pfVar33 = (float *)((this->weight_data_packed).cstep * local_120 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                pfVar28 = (float *)((long)local_c8.data +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar24) * 4 +
                                   0xc);
                uVar31 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pfVar26 = pfVar28;
                    iVar22 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      fVar42 = pfVar26[-3];
                      fVar64 = pfVar26[-2];
                      fVar55 = pfVar26[-1];
                      fVar66 = *pfVar26;
                      fVar69 = auVar74._4_4_;
                      fVar70 = auVar74._8_4_;
                      fVar71 = auVar74._12_4_;
                      auVar74._0_4_ =
                           pfVar33[0xc] * fVar66 +
                           pfVar33[8] * fVar55 + pfVar33[4] * fVar64 +
                           *pfVar33 * fVar42 + auVar74._0_4_;
                      auVar74._4_4_ =
                           pfVar33[0xd] * fVar66 +
                           pfVar33[9] * fVar55 + pfVar33[5] * fVar64 + pfVar33[1] * fVar42 + fVar69;
                      auVar74._8_4_ =
                           pfVar33[0xe] * fVar66 +
                           pfVar33[10] * fVar55 + pfVar33[6] * fVar64 + pfVar33[2] * fVar42 + fVar70
                      ;
                      auVar74._12_4_ =
                           pfVar33[0xf] * fVar66 +
                           pfVar33[0xb] * fVar55 + pfVar33[7] * fVar64 +
                           pfVar33[3] * fVar42 + fVar71;
                      pfVar33 = pfVar33 + 0x10;
                      pfVar26 = pfVar26 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 2);
                      iVar22 = iVar22 + -1;
                    } while (iVar22 != 0);
                  }
                  uVar31 = uVar31 + 1;
                  pfVar28 = (float *)((long)pfVar28 +
                                     (long)local_c8.w *
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     );
                } while (uVar31 != uVar32);
              }
              p_Var5 = pp_Var6[-3];
              fVar42 = auVar74._0_4_;
              fVar64 = auVar74._4_4_;
              fVar55 = auVar74._8_4_;
              fVar66 = auVar74._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar74 = maxps(auVar74,auVar48);
                break;
              case 2:
                auVar47 = maxps(auVar74,auVar48);
                auVar48 = minps(auVar74,auVar48);
                fVar42 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar74._4_4_ = fVar42 * auVar48._4_4_ + auVar47._4_4_;
                auVar74._0_4_ = fVar42 * auVar48._0_4_ + auVar47._0_4_;
                auVar74._8_4_ = fVar42 * auVar48._8_4_ + auVar47._8_4_;
                auVar74._12_4_ = fVar42 * auVar48._12_4_ + auVar47._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar45._4_4_ = uVar1;
                auVar45._0_4_ = uVar1;
                auVar45._8_4_ = uVar1;
                auVar45._12_4_ = uVar1;
                auVar48 = maxps(auVar74,auVar45);
                auVar11._4_4_ = uVar2;
                auVar11._0_4_ = uVar2;
                auVar11._8_4_ = uVar2;
                auVar11._12_4_ = uVar2;
                auVar74 = minps(auVar48,auVar11);
                break;
              case 4:
                auVar60._0_8_ = auVar74._0_8_ ^ 0x8000000080000000;
                auVar60._8_4_ = -fVar55;
                auVar60._12_4_ = -fVar66;
                auVar48 = minps(auVar60,_DAT_0054de60);
                auVar48 = maxps(auVar48,_DAT_0054de70);
                fVar64 = auVar48._0_4_ * 1.442695 + 0.5;
                fVar66 = auVar48._4_4_ * 1.442695 + 0.5;
                fVar70 = auVar48._8_4_ * 1.442695 + 0.5;
                fVar72 = auVar48._12_4_ * 1.442695 + 0.5;
                fVar42 = (float)(int)fVar64;
                fVar55 = (float)(int)fVar66;
                fVar69 = (float)(int)fVar70;
                fVar71 = (float)(int)fVar72;
                fVar42 = fVar42 - (float)(-(uint)(fVar64 < fVar42) & (uint)fVar38);
                fVar55 = fVar55 - (float)(-(uint)(fVar66 < fVar55) & (uint)fVar39);
                fVar69 = fVar69 - (float)(-(uint)(fVar70 < fVar69) & (uint)fVar40);
                fVar71 = fVar71 - (float)(-(uint)(fVar72 < fVar71) & (uint)fVar41);
                fVar64 = fVar42 * -0.6931472 + auVar48._0_4_;
                fVar66 = fVar55 * -0.6931472 + auVar48._4_4_;
                fVar70 = fVar69 * -0.6931472 + auVar48._8_4_;
                fVar72 = fVar71 * -0.6931472 + auVar48._12_4_;
                auVar46._0_4_ =
                     fVar64 + fVar38 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64;
                auVar46._4_4_ =
                     fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66;
                auVar46._8_4_ =
                     fVar70 + fVar40 +
                     (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
                       0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) * fVar70 * fVar70;
                auVar46._12_4_ =
                     fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72;
                fVar70 = (float)((int)fVar42 * 0x800000 + (int)fVar38) * auVar46._0_4_ + fVar38;
                fVar72 = (float)((int)fVar55 * 0x800000 + (int)fVar39) * auVar46._4_4_ + fVar39;
                fVar69 = (float)((int)fVar69 * 0x800000 + (int)fVar40) * auVar46._8_4_ + fVar40;
                fVar71 = (float)((int)fVar71 * 0x800000 + (int)fVar41) * auVar46._12_4_ + fVar41;
                auVar10._4_4_ = fVar72;
                auVar10._0_4_ = fVar70;
                auVar10._8_4_ = fVar69;
                auVar10._12_4_ = fVar71;
                auVar48 = rcpps(auVar46,auVar10);
                fVar42 = auVar48._0_4_;
                fVar64 = auVar48._4_4_;
                fVar55 = auVar48._8_4_;
                fVar66 = auVar48._12_4_;
                auVar74._0_4_ = (fVar38 - fVar70 * fVar42) * fVar42 + fVar42;
                auVar74._4_4_ = (fVar39 - fVar72 * fVar64) * fVar64 + fVar64;
                auVar74._8_4_ = (fVar40 - fVar69 * fVar55) * fVar55 + fVar55;
                auVar74._12_4_ = (fVar41 - fVar71 * fVar66) * fVar66 + fVar66;
                break;
              case 5:
                auVar48 = minps(auVar74,_DAT_0054de60);
                auVar48 = maxps(auVar48,_DAT_0054de70);
                fVar69 = auVar48._0_4_ * 1.442695 + 0.5;
                fVar70 = auVar48._4_4_ * 1.442695 + 0.5;
                fVar71 = auVar48._8_4_ * 1.442695 + 0.5;
                fVar72 = auVar48._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar69;
                fVar65 = (float)(int)fVar70;
                fVar67 = (float)(int)fVar71;
                fVar68 = (float)(int)fVar72;
                fVar63 = fVar63 - (float)(-(uint)(fVar69 < fVar63) & (uint)fVar38);
                fVar65 = fVar65 - (float)(-(uint)(fVar70 < fVar65) & (uint)fVar39);
                fVar67 = fVar67 - (float)(-(uint)(fVar71 < fVar67) & (uint)fVar40);
                fVar68 = fVar68 - (float)(-(uint)(fVar72 < fVar68) & (uint)fVar41);
                fVar69 = auVar48._0_4_ - fVar63 * 0.6931472;
                fVar70 = auVar48._4_4_ - fVar65 * 0.6931472;
                fVar71 = auVar48._8_4_ - fVar67 * 0.6931472;
                fVar72 = auVar48._12_4_ - fVar68 * 0.6931472;
                auVar73._0_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar38) *
                     (fVar69 + fVar38 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69) +
                     fVar38;
                auVar73._4_4_ =
                     (float)((int)fVar65 * 0x800000 + (int)fVar39) *
                     (fVar70 + fVar39 +
                     (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
                       0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) * fVar70 * fVar70) +
                     fVar39;
                auVar73._8_4_ =
                     (float)((int)fVar67 * 0x800000 + (int)fVar40) *
                     (fVar71 + fVar40 +
                     (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                       0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71) +
                     fVar40;
                auVar73._12_4_ =
                     (float)((int)fVar68 * 0x800000 + (int)fVar41) *
                     (fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72) +
                     fVar41;
                auVar74 = maxps(auVar73,_DAT_0054df10);
                fVar69 = (float)(auVar74._0_4_ & 0x807fffff | 0x3f000000);
                fVar71 = (float)(auVar74._4_4_ & 0x807fffff | 0x3f000000);
                fVar63 = (float)(auVar74._8_4_ & 0x807fffff | 0x3f000000);
                fVar67 = (float)(auVar74._12_4_ & 0x807fffff | 0x3f000000);
                fVar70 = fVar69 + -1.0 + (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar69);
                fVar72 = fVar71 + -1.0 + (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar71);
                fVar65 = fVar63 + -1.0 + (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar63);
                fVar68 = fVar67 + -1.0 + (float)(-(uint)(fVar67 < 0.70710677) & (uint)fVar67);
                auVar43._0_8_ =
                     CONCAT44(-(uint)(auVar73._4_4_ <= 0.0),-(uint)(auVar73._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar43._8_4_ = -(uint)(auVar73._8_4_ <= 0.0) & 0x7fffffff;
                auVar43._12_4_ = -(uint)(auVar73._12_4_ <= 0.0) & 0x7fffffff;
                auVar48._4_4_ =
                     ~-(uint)(auVar73._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar39)) * 0.6931472 +
                             fVar72 + (((((((((fVar72 * 0.070376836 + -0.1151461) * fVar72 +
                                             0.116769984) * fVar72 + -0.12420141) * fVar72 +
                                           0.14249323) * fVar72 + -0.16668057) * fVar72 + 0.20000714
                                         ) * fVar72 + -0.24999994) * fVar72 + 0.3333333) * fVar72 +
                                      -0.5) * fVar72 * fVar72) * -2.0);
                auVar48._0_4_ =
                     ~-(uint)(auVar73._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar38)) * 0.6931472 +
                             fVar70 + (((((((((fVar70 * 0.070376836 + -0.1151461) * fVar70 +
                                             0.116769984) * fVar70 + -0.12420141) * fVar70 +
                                           0.14249323) * fVar70 + -0.16668057) * fVar70 + 0.20000714
                                         ) * fVar70 + -0.24999994) * fVar70 + 0.3333333) * fVar70 +
                                      -0.5) * fVar70 * fVar70) * -2.0);
                auVar48._8_4_ =
                     ~-(uint)(auVar73._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar40)) * 0.6931472 +
                             fVar65 + (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                             0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                           0.14249323) * fVar65 + -0.16668057) * fVar65 + 0.20000714
                                         ) * fVar65 + -0.24999994) * fVar65 + 0.3333333) * fVar65 +
                                      -0.5) * fVar65 * fVar65) * -2.0);
                auVar48._12_4_ =
                     ~-(uint)(auVar73._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar74._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar67 < 0.70710677) & (uint)fVar41)) * 0.6931472 +
                             fVar68 + (((((((((fVar68 * 0.070376836 + -0.1151461) * fVar68 +
                                             0.116769984) * fVar68 + -0.12420141) * fVar68 +
                                           0.14249323) * fVar68 + -0.16668057) * fVar68 + 0.20000714
                                         ) * fVar68 + -0.24999994) * fVar68 + 0.3333333) * fVar68 +
                                      -0.5) * fVar68 * fVar68) * -2.0);
                auVar48 = minps(auVar43 | auVar48,_DAT_0054de60);
                auVar48 = maxps(auVar48,_DAT_0054de70);
                fVar69 = auVar48._0_4_ * 1.442695 + 0.5;
                fVar70 = auVar48._4_4_ * 1.442695 + 0.5;
                fVar71 = auVar48._8_4_ * 1.442695 + 0.5;
                fVar72 = auVar48._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar69;
                fVar65 = (float)(int)fVar70;
                fVar67 = (float)(int)fVar71;
                fVar68 = (float)(int)fVar72;
                fVar63 = fVar63 - (float)(-(uint)(fVar69 < fVar63) & (uint)fVar38);
                fVar65 = fVar65 - (float)(-(uint)(fVar70 < fVar65) & (uint)fVar39);
                fVar67 = fVar67 - (float)(-(uint)(fVar71 < fVar67) & (uint)fVar40);
                fVar68 = fVar68 - (float)(-(uint)(fVar72 < fVar68) & (uint)fVar41);
                fVar69 = auVar48._0_4_ - fVar63 * 0.6931472;
                fVar70 = auVar48._4_4_ - fVar65 * 0.6931472;
                fVar71 = auVar48._8_4_ - fVar67 * 0.6931472;
                fVar72 = auVar48._12_4_ - fVar68 * 0.6931472;
                auVar44._0_4_ =
                     fVar69 + fVar38 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                auVar44._4_4_ =
                     fVar70 + fVar39 +
                     (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
                       0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) * fVar70 * fVar70;
                auVar44._8_4_ =
                     fVar71 + fVar40 +
                     (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                       0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71;
                auVar44._12_4_ =
                     fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72;
                fVar63 = (float)((int)fVar63 * 0x800000 + (int)fVar38) * auVar44._0_4_ + fVar38;
                fVar65 = (float)((int)fVar65 * 0x800000 + (int)fVar39) * auVar44._4_4_ + fVar39;
                fVar67 = (float)((int)fVar67 * 0x800000 + (int)fVar40) * auVar44._8_4_ + fVar40;
                fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar41) * auVar44._12_4_ + fVar41;
                auVar53._4_4_ = fVar65;
                auVar53._0_4_ = fVar63;
                auVar53._8_4_ = fVar67;
                auVar53._12_4_ = fVar68;
                auVar48 = rcpps(auVar44,auVar53);
                fVar69 = auVar48._0_4_;
                fVar70 = auVar48._4_4_;
                fVar71 = auVar48._8_4_;
                fVar72 = auVar48._12_4_;
                auVar74._0_4_ =
                     fVar42 * (fVar69 + fVar69 + -1.0 + (2.0 - fVar63 * (fVar69 + fVar69)) * fVar69)
                ;
                auVar74._4_4_ =
                     fVar64 * (fVar70 + fVar70 + -1.0 + (2.0 - fVar65 * (fVar70 + fVar70)) * fVar70)
                ;
                auVar74._8_4_ =
                     fVar55 * (fVar71 + fVar71 + -1.0 + (2.0 - fVar67 * (fVar71 + fVar71)) * fVar71)
                ;
                auVar74._12_4_ =
                     fVar66 * (fVar72 + fVar72 + -1.0 + (2.0 - fVar68 * (fVar72 + fVar72)) * fVar72)
                ;
                break;
              case 6:
                fVar69 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar70 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar47._0_4_ = fVar69 * fVar42 + fVar70;
                auVar47._4_4_ = fVar69 * fVar64 + fVar70;
                auVar47._8_4_ = fVar69 * fVar55 + fVar70;
                auVar47._12_4_ = fVar69 * fVar66 + fVar70;
                auVar48 = maxps(auVar47,auVar48);
                auVar48 = minps(auVar48,auVar37);
                auVar74._0_4_ = fVar42 * auVar48._0_4_;
                auVar74._4_4_ = fVar64 * auVar48._4_4_;
                auVar74._8_4_ = fVar55 * auVar48._8_4_;
                auVar74._12_4_ = fVar66 * auVar48._12_4_;
              }
              *pauVar29 = auVar74;
              pauVar29 = pauVar29 + 1;
              iVar24 = iVar24 + 4;
              bVar35 = iVar25 != iVar4;
              iVar25 = iVar25 + 1;
            } while (bVar35);
          }
          local_120 = local_120 + 1;
        } while (local_120 != _h);
      }
      auVar74 = _DAT_0054dea0;
      auVar48 = _DAT_0054de70;
      auVar37 = _DAT_0054de60;
      local_78._0_4_ = _elempack ^ 4 | uVar3 ^ 1;
      if (local_78._0_4_ == 0 && 0 < (int)_h) {
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar31 = 0;
        fVar38 = (float)DAT_0054dea0;
        fVar39 = DAT_0054dea0._4_4_;
        fVar40 = DAT_0054dea0._8_4_;
        fVar41 = DAT_0054dea0._12_4_;
        do {
          if (-1 < iVar4) {
            pauVar29 = (undefined1 (*) [16])
                       ((long)top_blob->w * uVar31 * top_blob->elemsize + (long)top_blob->data);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar25 = 0;
            do {
              auVar47 = ZEXT816(0);
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar61 = ZEXT816(0);
              }
              else {
                auVar61 = *(undefined1 (*) [16])
                           (*(long *)(&this->field_0x190 + (long)p_Var5) + uVar31 * 0x10);
              }
              if (0 < iVar20) {
                pfVar28 = (float *)((this->weight_data_packed).cstep * uVar31 *
                                    (this->weight_data_packed).elemsize +
                                   (long)(this->weight_data_packed).data);
                p_Var5 = pp_Var7[-3];
                pfVar33 = (float *)((long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar25) * 4
                                   + (long)local_c8.data);
                uVar23 = 0;
                do {
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pfVar26 = pfVar33;
                    auVar53 = auVar61;
                    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      fVar42 = *pfVar26;
                      auVar61._0_4_ = auVar53._0_4_ + *pfVar28 * fVar42;
                      auVar61._4_4_ = auVar53._4_4_ + pfVar28[1] * fVar42;
                      auVar61._8_4_ = auVar53._8_4_ + pfVar28[2] * fVar42;
                      auVar61._12_4_ = auVar53._12_4_ + pfVar28[3] * fVar42;
                      pfVar28 = pfVar28 + 4;
                      pfVar26 = pfVar26 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar24 = iVar24 + -1;
                      auVar53 = auVar61;
                    } while (iVar24 != 0);
                  }
                  uVar23 = uVar23 + 1;
                  pfVar33 = (float *)((long)pfVar33 +
                                     (long)local_c8.w *
                                     CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize)
                                     );
                } while (uVar23 != uVar32);
              }
              p_Var5 = pp_Var6[-3];
              fVar42 = auVar61._0_4_;
              fVar64 = auVar61._4_4_;
              fVar55 = auVar61._8_4_;
              fVar66 = auVar61._12_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                auVar61 = maxps(auVar61,auVar47);
                break;
              case 2:
                auVar53 = maxps(auVar61,auVar47);
                auVar47 = minps(auVar61,auVar47);
                fVar42 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                auVar61._4_4_ = fVar42 * auVar47._4_4_ + auVar53._4_4_;
                auVar61._0_4_ = fVar42 * auVar47._0_4_ + auVar53._0_4_;
                auVar61._8_4_ = fVar42 * auVar47._8_4_ + auVar53._8_4_;
                auVar61._12_4_ = fVar42 * auVar47._12_4_ + auVar53._12_4_;
                break;
              case 3:
                uVar1 = **(undefined4 **)(&this->field_0xf8 + (long)p_Var5);
                uVar2 = (*(undefined4 **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar51._4_4_ = uVar1;
                auVar51._0_4_ = uVar1;
                auVar51._8_4_ = uVar1;
                auVar51._12_4_ = uVar1;
                auVar47 = maxps(auVar61,auVar51);
                auVar13._4_4_ = uVar2;
                auVar13._0_4_ = uVar2;
                auVar13._8_4_ = uVar2;
                auVar13._12_4_ = uVar2;
                auVar61 = minps(auVar47,auVar13);
                break;
              case 4:
                auVar62._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
                auVar62._8_4_ = -fVar55;
                auVar62._12_4_ = -fVar66;
                auVar47 = minps(auVar62,auVar37);
                auVar47 = maxps(auVar47,auVar48);
                fVar64 = auVar47._0_4_ * 1.442695 + 0.5;
                fVar66 = auVar47._4_4_ * 1.442695 + 0.5;
                fVar70 = auVar47._8_4_ * 1.442695 + 0.5;
                fVar72 = auVar47._12_4_ * 1.442695 + 0.5;
                fVar42 = (float)(int)fVar64;
                fVar55 = (float)(int)fVar66;
                fVar69 = (float)(int)fVar70;
                fVar71 = (float)(int)fVar72;
                fVar42 = fVar42 - (float)(-(uint)(fVar64 < fVar42) & (uint)fVar38);
                fVar55 = fVar55 - (float)(-(uint)(fVar66 < fVar55) & (uint)fVar39);
                fVar69 = fVar69 - (float)(-(uint)(fVar70 < fVar69) & (uint)fVar40);
                fVar71 = fVar71 - (float)(-(uint)(fVar72 < fVar71) & (uint)fVar41);
                fVar64 = fVar42 * -0.6931472 + auVar47._0_4_;
                fVar66 = fVar55 * -0.6931472 + auVar47._4_4_;
                fVar70 = fVar69 * -0.6931472 + auVar47._8_4_;
                fVar72 = fVar71 * -0.6931472 + auVar47._12_4_;
                auVar52._0_4_ =
                     fVar64 + fVar38 +
                     (((((fVar64 * 0.00019875691 + 0.0013981999) * fVar64 + 0.008333452) * fVar64 +
                       0.041665796) * fVar64 + 0.16666666) * fVar64 + 0.5) * fVar64 * fVar64;
                auVar52._4_4_ =
                     fVar66 + fVar39 +
                     (((((fVar66 * 0.00019875691 + 0.0013981999) * fVar66 + 0.008333452) * fVar66 +
                       0.041665796) * fVar66 + 0.16666666) * fVar66 + 0.5) * fVar66 * fVar66;
                auVar52._8_4_ =
                     fVar70 + fVar40 +
                     (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
                       0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) * fVar70 * fVar70;
                auVar52._12_4_ =
                     fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72;
                fVar70 = (float)((int)fVar42 * 0x800000 + (int)fVar38) * auVar52._0_4_ + fVar38;
                fVar72 = (float)((int)fVar55 * 0x800000 + (int)fVar39) * auVar52._4_4_ + fVar39;
                fVar69 = (float)((int)fVar69 * 0x800000 + (int)fVar40) * auVar52._8_4_ + fVar40;
                fVar71 = (float)((int)fVar71 * 0x800000 + (int)fVar41) * auVar52._12_4_ + fVar41;
                auVar12._4_4_ = fVar72;
                auVar12._0_4_ = fVar70;
                auVar12._8_4_ = fVar69;
                auVar12._12_4_ = fVar71;
                auVar47 = rcpps(auVar52,auVar12);
                fVar42 = auVar47._0_4_;
                fVar64 = auVar47._4_4_;
                fVar55 = auVar47._8_4_;
                fVar66 = auVar47._12_4_;
                auVar61._0_4_ = (fVar38 - fVar70 * fVar42) * fVar42 + fVar42;
                auVar61._4_4_ = (fVar39 - fVar72 * fVar64) * fVar64 + fVar64;
                auVar61._8_4_ = (fVar40 - fVar69 * fVar55) * fVar55 + fVar55;
                auVar61._12_4_ = (fVar41 - fVar71 * fVar66) * fVar66 + fVar66;
                break;
              case 5:
                auVar47 = minps(auVar61,auVar37);
                auVar47 = maxps(auVar47,auVar48);
                fVar69 = auVar47._0_4_ * 1.442695 + 0.5;
                fVar70 = auVar47._4_4_ * 1.442695 + 0.5;
                fVar71 = auVar47._8_4_ * 1.442695 + 0.5;
                fVar72 = auVar47._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar69;
                fVar65 = (float)(int)fVar70;
                fVar67 = (float)(int)fVar71;
                fVar68 = (float)(int)fVar72;
                fVar63 = fVar63 - (float)(-(uint)(fVar69 < fVar63) & (uint)fVar38);
                fVar65 = fVar65 - (float)(-(uint)(fVar70 < fVar65) & (uint)fVar39);
                fVar67 = fVar67 - (float)(-(uint)(fVar71 < fVar67) & (uint)fVar40);
                fVar68 = fVar68 - (float)(-(uint)(fVar72 < fVar68) & (uint)fVar41);
                fVar69 = auVar47._0_4_ - fVar63 * 0.6931472;
                fVar70 = auVar47._4_4_ - fVar65 * 0.6931472;
                fVar71 = auVar47._8_4_ - fVar67 * 0.6931472;
                fVar72 = auVar47._12_4_ - fVar68 * 0.6931472;
                auVar75._0_4_ =
                     (float)((int)fVar63 * 0x800000 + (int)fVar38) *
                     (fVar69 + fVar38 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69) +
                     fVar38;
                auVar75._4_4_ =
                     (float)((int)fVar65 * 0x800000 + (int)fVar39) *
                     (fVar70 + fVar39 +
                     (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
                       0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) * fVar70 * fVar70) +
                     fVar39;
                auVar75._8_4_ =
                     (float)((int)fVar67 * 0x800000 + (int)fVar40) *
                     (fVar71 + fVar40 +
                     (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                       0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71) +
                     fVar40;
                auVar75._12_4_ =
                     (float)((int)fVar68 * 0x800000 + (int)fVar41) *
                     (fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72) +
                     fVar41;
                auVar47 = maxps(auVar75,_DAT_0054df10);
                fVar69 = (float)(auVar47._0_4_ & 0x807fffff | 0x3f000000);
                fVar71 = (float)(auVar47._4_4_ & 0x807fffff | 0x3f000000);
                fVar63 = (float)(auVar47._8_4_ & 0x807fffff | 0x3f000000);
                fVar67 = (float)(auVar47._12_4_ & 0x807fffff | 0x3f000000);
                fVar70 = fVar69 + -1.0 + (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar69);
                fVar72 = fVar71 + -1.0 + (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar71);
                fVar65 = fVar63 + -1.0 + (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar63);
                fVar68 = fVar67 + -1.0 + (float)(-(uint)(fVar67 < 0.70710677) & (uint)fVar67);
                auVar49._0_8_ =
                     CONCAT44(-(uint)(auVar75._4_4_ <= 0.0),-(uint)(auVar75._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar49._8_4_ = -(uint)(auVar75._8_4_ <= 0.0) & 0x7fffffff;
                auVar49._12_4_ = -(uint)(auVar75._12_4_ <= 0.0) & 0x7fffffff;
                auVar9._4_4_ = ~-(uint)(auVar75._4_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar47._4_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar71 < 0.70710677) & (uint)fVar39)) *
                                       0.6931472 + fVar72 +
                                      (((((((((fVar72 * 0.070376836 + -0.1151461) * fVar72 +
                                             0.116769984) * fVar72 + -0.12420141) * fVar72 +
                                           0.14249323) * fVar72 + -0.16668057) * fVar72 + 0.20000714
                                         ) * fVar72 + -0.24999994) * fVar72 + 0.3333333) * fVar72 +
                                      -0.5) * fVar72 * fVar72) * -2.0);
                auVar9._0_4_ = ~-(uint)(auVar75._0_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar47._0_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar69 < 0.70710677) & (uint)fVar38)) *
                                       0.6931472 + fVar70 +
                                      (((((((((fVar70 * 0.070376836 + -0.1151461) * fVar70 +
                                             0.116769984) * fVar70 + -0.12420141) * fVar70 +
                                           0.14249323) * fVar70 + -0.16668057) * fVar70 + 0.20000714
                                         ) * fVar70 + -0.24999994) * fVar70 + 0.3333333) * fVar70 +
                                      -0.5) * fVar70 * fVar70) * -2.0);
                auVar9._8_4_ = ~-(uint)(auVar75._8_4_ <= 0.0) &
                               (uint)((((float)(int)((auVar47._8_4_ >> 0x17) - 0x7e) -
                                       (float)(-(uint)(fVar63 < 0.70710677) & (uint)fVar40)) *
                                       0.6931472 + fVar65 +
                                      (((((((((fVar65 * 0.070376836 + -0.1151461) * fVar65 +
                                             0.116769984) * fVar65 + -0.12420141) * fVar65 +
                                           0.14249323) * fVar65 + -0.16668057) * fVar65 + 0.20000714
                                         ) * fVar65 + -0.24999994) * fVar65 + 0.3333333) * fVar65 +
                                      -0.5) * fVar65 * fVar65) * -2.0);
                auVar9._12_4_ =
                     ~-(uint)(auVar75._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar47._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar67 < 0.70710677) & (uint)fVar41)) * 0.6931472 +
                             fVar68 + (((((((((fVar68 * 0.070376836 + -0.1151461) * fVar68 +
                                             0.116769984) * fVar68 + -0.12420141) * fVar68 +
                                           0.14249323) * fVar68 + -0.16668057) * fVar68 + 0.20000714
                                         ) * fVar68 + -0.24999994) * fVar68 + 0.3333333) * fVar68 +
                                      -0.5) * fVar68 * fVar68) * -2.0);
                auVar47 = minps(auVar49 | auVar9,auVar37);
                auVar47 = maxps(auVar47,auVar48);
                fVar69 = auVar47._0_4_ * 1.442695 + 0.5;
                fVar70 = auVar47._4_4_ * 1.442695 + 0.5;
                fVar71 = auVar47._8_4_ * 1.442695 + 0.5;
                fVar72 = auVar47._12_4_ * 1.442695 + 0.5;
                fVar63 = (float)(int)fVar69;
                fVar65 = (float)(int)fVar70;
                fVar67 = (float)(int)fVar71;
                fVar68 = (float)(int)fVar72;
                fVar63 = fVar63 - (float)(-(uint)(fVar69 < fVar63) & (uint)fVar38);
                fVar65 = fVar65 - (float)(-(uint)(fVar70 < fVar65) & (uint)fVar39);
                fVar67 = fVar67 - (float)(-(uint)(fVar71 < fVar67) & (uint)fVar40);
                fVar68 = fVar68 - (float)(-(uint)(fVar72 < fVar68) & (uint)fVar41);
                fVar69 = auVar47._0_4_ - fVar63 * 0.6931472;
                fVar70 = auVar47._4_4_ - fVar65 * 0.6931472;
                fVar71 = auVar47._8_4_ - fVar67 * 0.6931472;
                fVar72 = auVar47._12_4_ - fVar68 * 0.6931472;
                auVar50._0_4_ =
                     fVar69 + fVar38 +
                     (((((fVar69 * 0.00019875691 + 0.0013981999) * fVar69 + 0.008333452) * fVar69 +
                       0.041665796) * fVar69 + 0.16666666) * fVar69 + 0.5) * fVar69 * fVar69;
                auVar50._4_4_ =
                     fVar70 + fVar39 +
                     (((((fVar70 * 0.00019875691 + 0.0013981999) * fVar70 + 0.008333452) * fVar70 +
                       0.041665796) * fVar70 + 0.16666666) * fVar70 + 0.5) * fVar70 * fVar70;
                auVar50._8_4_ =
                     fVar71 + fVar40 +
                     (((((fVar71 * 0.00019875691 + 0.0013981999) * fVar71 + 0.008333452) * fVar71 +
                       0.041665796) * fVar71 + 0.16666666) * fVar71 + 0.5) * fVar71 * fVar71;
                auVar50._12_4_ =
                     fVar72 + fVar41 +
                     (((((fVar72 * 0.00019875691 + 0.0013981999) * fVar72 + 0.008333452) * fVar72 +
                       0.041665796) * fVar72 + 0.16666666) * fVar72 + 0.5) * fVar72 * fVar72;
                fVar63 = (float)((int)fVar63 * 0x800000 + (int)fVar38) * auVar50._0_4_ + fVar38;
                fVar65 = (float)((int)fVar65 * 0x800000 + (int)fVar39) * auVar50._4_4_ + fVar39;
                fVar67 = (float)((int)fVar67 * 0x800000 + (int)fVar40) * auVar50._8_4_ + fVar40;
                fVar68 = (float)((int)fVar68 * 0x800000 + (int)fVar41) * auVar50._12_4_ + fVar41;
                auVar14._4_4_ = fVar65;
                auVar14._0_4_ = fVar63;
                auVar14._8_4_ = fVar67;
                auVar14._12_4_ = fVar68;
                auVar47 = rcpps(auVar50,auVar14);
                fVar69 = auVar47._0_4_;
                fVar70 = auVar47._4_4_;
                fVar71 = auVar47._8_4_;
                fVar72 = auVar47._12_4_;
                auVar61._0_4_ =
                     fVar42 * (fVar69 + fVar69 + -1.0 + (2.0 - fVar63 * (fVar69 + fVar69)) * fVar69)
                ;
                auVar61._4_4_ =
                     fVar64 * (fVar70 + fVar70 + -1.0 + (2.0 - fVar65 * (fVar70 + fVar70)) * fVar70)
                ;
                auVar61._8_4_ =
                     fVar55 * (fVar71 + fVar71 + -1.0 + (2.0 - fVar67 * (fVar71 + fVar71)) * fVar71)
                ;
                auVar61._12_4_ =
                     fVar66 * (fVar72 + fVar72 + -1.0 + (2.0 - fVar68 * (fVar72 + fVar72)) * fVar72)
                ;
                break;
              case 6:
                fVar69 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar70 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                auVar54._0_4_ = fVar69 * fVar42 + fVar70;
                auVar54._4_4_ = fVar69 * fVar64 + fVar70;
                auVar54._8_4_ = fVar69 * fVar55 + fVar70;
                auVar54._12_4_ = fVar69 * fVar66 + fVar70;
                auVar47 = maxps(auVar54,auVar47);
                auVar47 = minps(auVar47,auVar74);
                auVar61._0_4_ = fVar42 * auVar47._0_4_;
                auVar61._4_4_ = fVar64 * auVar47._4_4_;
                auVar61._8_4_ = fVar55 * auVar47._8_4_;
                auVar61._12_4_ = fVar66 * auVar47._12_4_;
              }
              *pauVar29 = auVar61;
              pauVar29 = pauVar29 + 1;
              bVar35 = iVar25 != iVar4;
              iVar25 = iVar25 + 1;
            } while (bVar35);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != _h);
      }
      if ((uVar3 == 4 && (_elempack ^ 1) == 0) && 0 < (int)_h) {
        local_40 = top_blob->data;
        local_48 = (long)top_blob->w * top_blob->elemsize;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        local_50 = (this->weight_data_packed).data;
        local_58 = (this->weight_data_packed).cstep * (this->weight_data_packed).elemsize;
        local_38 = (ulong)_h;
        uVar31 = 0;
        do {
          pvVar19 = local_40;
          pvVar8 = local_c8.data;
          if (-1 < iVar4) {
            lVar21 = local_48 * uVar31;
            pfVar28 = (float *)(local_58 * uVar31 + (long)local_50);
            lVar34 = (long)local_c8.w;
            lVar18 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
            pp_Var7 = this->_vptr_Convolution1D_x86;
            iVar25 = 0;
            uVar23 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar36 = ZEXT812(0);
              }
              else {
                auVar36._4_8_ = 0;
                auVar36._0_4_ = *(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar31 * 4)
                ;
              }
              auVar37._12_4_ = 0;
              auVar37._0_12_ = auVar36;
              if (iVar20 < 1) {
                auVar37._12_4_ = 0;
              }
              else {
                p_Var5 = pp_Var7[-3];
                pfVar33 = (float *)((long)pvVar8 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * iVar25) * 4);
                uVar27 = 0;
                pfVar26 = pfVar28;
                do {
                  auVar58 = auVar37;
                  if (0 < *(int *)(&this->field_0xd4 + (long)p_Var5)) {
                    pfVar30 = pfVar33;
                    iVar24 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                    do {
                      auVar57._4_4_ = pfVar26[3] * pfVar30[3] + pfVar26[1] * pfVar30[1];
                      auVar57._0_4_ = auVar57._4_4_;
                      auVar57._8_4_ = auVar57._4_4_;
                      auVar57._12_4_ = auVar57._4_4_;
                      auVar58._4_12_ = auVar57._4_12_;
                      auVar58._0_4_ =
                           auVar57._4_4_ +
                           auVar37._0_4_ + pfVar26[2] * pfVar30[2] + *pfVar26 * *pfVar30;
                      pfVar26 = pfVar26 + 4;
                      pfVar30 = pfVar30 + (*(int *)(&this->field_0xd8 + (long)p_Var5) << 2);
                      auVar37._4_4_ = auVar57._4_4_;
                      auVar37._0_4_ = auVar58._0_4_;
                      auVar37._8_4_ = auVar57._4_4_;
                      auVar37._12_4_ = auVar57._4_4_;
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  auVar37 = auVar58;
                  uVar27 = uVar27 + 1;
                  pfVar33 = (float *)((long)pfVar33 + lVar34 * lVar18);
                } while (uVar27 != uVar32);
              }
              fVar38 = auVar37._0_4_;
              p_Var5 = pp_Var6[-3];
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar38 <= 0.0) {
                  auVar15._12_4_ = 0;
                  auVar15._0_12_ = auVar37._4_12_;
                  auVar37 = auVar15 << 0x20;
                }
              default:
switchD_0052537f_default:
                fVar39 = auVar37._0_4_;
                break;
              case 2:
                fVar39 = (float)(-(uint)(0.0 < fVar38) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar38) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar38;
                break;
              case 3:
                fVar39 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar38 <= fVar39) {
                  auVar37._0_4_ = fVar39;
                }
                fVar39 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                if (auVar37._0_4_ <= fVar39) {
                  fVar39 = auVar37._0_4_;
                }
                break;
              case 4:
                if (88.37626 <= fVar38) {
                  fVar38 = 88.37626;
                }
                fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar38 < -88.37626) & (uint)-fVar38));
                fVar39 = 1.0 / (fVar38 + 1.0);
                break;
              case 5:
                local_78 = auVar37;
                fVar38 = expf(fVar38);
                fVar38 = logf(fVar38 + 1.0);
                fVar38 = tanhf(fVar38);
                fVar39 = fVar38 * (float)local_78._0_4_;
                break;
              case 6:
                fVar40 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar41 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar42 = -fVar41 / fVar40;
                fVar39 = 0.0;
                if (fVar42 <= fVar38) {
                  if (fVar42 + 1.0 / fVar40 < fVar38) goto switchD_0052537f_default;
                  fVar39 = (fVar40 * fVar38 + fVar41) * fVar38;
                }
              }
              *(float *)((long)pvVar19 + uVar23 * 4 + lVar21) = fVar39;
              uVar23 = uVar23 + 1;
              iVar25 = iVar25 + 4;
            } while (uVar23 != local_60);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != local_38);
      }
      if (((_elempack ^ 1) == 0 && uVar3 == 1) && 0 < (int)_h) {
        pvVar8 = top_blob->data;
        local_78._0_8_ = (long)top_blob->w * top_blob->elemsize;
        pp_Var6 = this->_vptr_Convolution1D_x86;
        uVar31 = 0;
        do {
          pvVar19 = local_c8.data;
          if (-1 < iVar4) {
            lVar21 = local_78._0_8_ * uVar31;
            lVar34 = (long)local_c8.w;
            lVar18 = CONCAT44(local_c8.elemsize._4_4_,(undefined4)local_c8.elemsize);
            uVar23 = 0;
            do {
              p_Var5 = pp_Var6[-3];
              if (*(int *)(&this->field_0xec + (long)p_Var5) == 0) {
                auVar56 = ZEXT812(0);
              }
              else {
                auVar56._4_8_ = 0;
                auVar56._0_4_ = *(uint *)(*(long *)(&this->field_0x190 + (long)p_Var5) + uVar31 * 4)
                ;
              }
              auVar59._12_4_ = 0;
              auVar59._0_12_ = auVar56;
              if (0 < iVar20) {
                iVar25 = *(int *)(&this->field_0xd4 + (long)p_Var5);
                pfVar33 = (float *)((long)((int)uVar31 * iVar20 * iVar25) * 4 +
                                   *(long *)(&this->field_0x148 + (long)p_Var5));
                pfVar28 = (float *)((long)pvVar19 +
                                   (long)(*(int *)(&this->field_0xdc + (long)p_Var5) * (int)uVar23)
                                   * 4);
                uVar27 = 0;
                do {
                  if (0 < iVar25) {
                    pfVar26 = pfVar28;
                    iVar24 = iVar25;
                    do {
                      auVar59._0_4_ = auVar59._0_4_ + *pfVar33 * *pfVar26;
                      pfVar33 = pfVar33 + 1;
                      pfVar26 = pfVar26 + *(int *)(&this->field_0xd8 + (long)p_Var5);
                      iVar24 = iVar24 + -1;
                    } while (iVar24 != 0);
                  }
                  uVar27 = uVar27 + 1;
                  pfVar28 = (float *)((long)pfVar28 + lVar34 * lVar18);
                } while (uVar27 != uVar32);
              }
              fVar38 = auVar59._0_4_;
              switch(*(undefined4 *)(&this->field_0xf4 + (long)p_Var5)) {
              case 1:
                if (fVar38 <= 0.0) {
                  auVar16._12_4_ = 0;
                  auVar16._0_12_ = auVar59._4_12_;
                  auVar59 = auVar16 << 0x20;
                }
              default:
switchD_00525624_default:
                fVar39 = auVar59._0_4_;
                break;
              case 2:
                fVar39 = (float)(-(uint)(0.0 < fVar38) & 0x3f800000 |
                                ~-(uint)(0.0 < fVar38) &
                                **(uint **)(&this->field_0xf8 + (long)p_Var5)) * fVar38;
                break;
              case 3:
                fVar39 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                if (fVar38 <= fVar39) {
                  auVar59._0_4_ = fVar39;
                }
                fVar39 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                if (auVar59._0_4_ <= fVar39) {
                  fVar39 = auVar59._0_4_;
                }
                break;
              case 4:
                if (88.37626 <= fVar38) {
                  fVar38 = 88.37626;
                }
                fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                                     ~-(uint)(fVar38 < -88.37626) & (uint)-fVar38));
                fVar39 = 1.0 / (fVar38 + 1.0);
                break;
              case 5:
                fVar39 = expf(fVar38);
                fVar39 = logf(fVar39 + 1.0);
                fVar39 = tanhf(fVar39);
                fVar39 = fVar39 * fVar38;
                break;
              case 6:
                fVar40 = **(float **)(&this->field_0xf8 + (long)p_Var5);
                fVar41 = (*(float **)(&this->field_0xf8 + (long)p_Var5))[1];
                fVar42 = -fVar41 / fVar40;
                fVar39 = 0.0;
                if (fVar42 <= fVar38) {
                  if (fVar42 + 1.0 / fVar40 < fVar38) goto switchD_00525624_default;
                  fVar39 = (fVar40 * fVar38 + fVar41) * fVar38;
                }
              }
              *(float *)((long)pvVar8 + uVar23 * 4 + lVar21) = fVar39;
              uVar23 = uVar23 + 1;
            } while (uVar23 != local_60);
          }
          uVar31 = uVar31 + 1;
        } while (uVar31 != _h);
      }
      iVar24 = 0;
    }
  }
  piVar17 = (int *)CONCAT44(local_c8.refcount._4_4_,local_c8.refcount._0_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        if (local_c8.data != (void *)0x0) {
          free(local_c8.data);
        }
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar24;
}

Assistant:

int Convolution1D_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

#if __AVX512F__
    if (elempack == 16)
    {
        Mat tmp;
        convert_packing(bottom_blob, tmp, 8, opt);

        Mat tmpout;
        forward(tmp, tmpout, opt);

        convert_packing(tmpout, top_blob, 16, opt);

        return 0;
    }
#endif // __AVX512F__

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);
                            __m256 _val4 = _mm256_broadcast_ss(sptr + 4);
                            __m256 _val5 = _mm256_broadcast_ss(sptr + 5);
                            __m256 _val6 = _mm256_broadcast_ss(sptr + 6);
                            __m256 _val7 = _mm256_broadcast_ss(sptr + 7);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            __m256 _w4 = _mm256_loadu_ps(kptr + 32);
                            __m256 _w5 = _mm256_loadu_ps(kptr + 40);
                            __m256 _w6 = _mm256_loadu_ps(kptr + 48);
                            __m256 _w7 = _mm256_loadu_ps(kptr + 56);

                            _mm256_comp_fmadd_ps8(_sum,
                                                  _val0, _val1, _val2, _val3, _val4, _val5, _val6, _val7,
                                                  _w0, _w1, _w2, _w3, _w4, _w5, _w6, _w7);

                            sptr += dilation_w * 8;
                            kptr += 64;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps(((const float*)bias_data) + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val = _mm256_set1_ps(sptr[0]);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val, _w, _sum);

                            sptr += dilation_w;
                            kptr += 8;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 8)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m256 _sum = _mm256_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm256_loadu_ps((const float*)bias_data + p * 8);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m256 _val0 = _mm256_broadcast_ss(sptr);
                            __m256 _val1 = _mm256_broadcast_ss(sptr + 1);
                            __m256 _val2 = _mm256_broadcast_ss(sptr + 2);
                            __m256 _val3 = _mm256_broadcast_ss(sptr + 3);

                            __m256 _w0 = _mm256_loadu_ps(kptr);
                            _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                            __m256 _w1 = _mm256_loadu_ps(kptr + 8);
                            _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                            __m256 _w2 = _mm256_loadu_ps(kptr + 16);
                            _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                            __m256 _w3 = _mm256_loadu_ps(kptr + 24);
                            _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);

                            sptr += dilation_w * 4;
                            kptr += 32;
                        }
                    }

                    _sum = activation_avx(_sum, activation_type, activation_params);

                    _mm256_storeu_ps(outptr, _sum);
                    outptr += 8;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    __m256 _sum8 = _mm256_set1_ps(0);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++) // 29.23
                        {
                            __m256 _val = _mm256_loadu_ps(sptr);
                            __m256 _w = _mm256_loadu_ps(kptr);
                            __m256 _s8 = _mm256_mul_ps(_val, _w);
                            _sum8 = _mm256_add_ps(_sum8, _s8);

                            sptr += dilation_w * 8;
                            kptr += 8;
                        }
                    }
                    sum += _mm256_reduce_add_ps(_sum8); // dot
                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    if (elempack == 8 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 8;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_broadcast_ss(sptr);
                            __m128 _val1 = _mm_broadcast_ss(sptr + 1);
                            __m128 _val2 = _mm_broadcast_ss(sptr + 2);
                            __m128 _val3 = _mm_broadcast_ss(sptr + 3);
                            __m128 _val4 = _mm_broadcast_ss(sptr + 4);
                            __m128 _val5 = _mm_broadcast_ss(sptr + 5);
                            __m128 _val6 = _mm_broadcast_ss(sptr + 6);
                            __m128 _val7 = _mm_broadcast_ss(sptr + 7);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_comp_fmadd_ps(_val0, _w0, _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_comp_fmadd_ps(_val1, _w1, _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_comp_fmadd_ps(_val2, _w2, _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_comp_fmadd_ps(_val3, _w3, _sum);
                            __m128 _w4 = _mm_loadu_ps(kptr + 16);
                            _sum = _mm_comp_fmadd_ps(_val4, _w4, _sum);
                            __m128 _w5 = _mm_loadu_ps(kptr + 20);
                            _sum = _mm_comp_fmadd_ps(_val5, _w5, _sum);
                            __m128 _w6 = _mm_loadu_ps(kptr + 24);
                            _sum = _mm_comp_fmadd_ps(_val6, _w6, _sum);
                            __m128 _w7 = _mm_loadu_ps(kptr + 28);
                            _sum = _mm_comp_fmadd_ps(_val7, _w7, _sum);

                            sptr += dilation_w * 8;
                            kptr += 32;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }
#endif

    if (elempack == 4 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val0 = _mm_set1_ps(sptr[0]);
                            __m128 _val1 = _mm_set1_ps(sptr[1]);
                            __m128 _val2 = _mm_set1_ps(sptr[2]);
                            __m128 _val3 = _mm_set1_ps(sptr[3]);

                            __m128 _w0 = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val0, _w0), _sum);
                            __m128 _w1 = _mm_loadu_ps(kptr + 4);
                            _sum = _mm_add_ps(_mm_mul_ps(_val1, _w1), _sum);
                            __m128 _w2 = _mm_loadu_ps(kptr + 8);
                            _sum = _mm_add_ps(_mm_mul_ps(_val2, _w2), _sum);
                            __m128 _w3 = _mm_loadu_ps(kptr + 12);
                            _sum = _mm_add_ps(_mm_mul_ps(_val3, _w3), _sum);

                            sptr += dilation_w * 4;
                            kptr += 16;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 1 && out_elempack == 4)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    __m128 _sum = _mm_set1_ps(0.f);

                    if (bias_term)
                    {
                        _sum = _mm_loadu_ps((const float*)bias_data + p * 4);
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_set1_ps(sptr[0]);
                            __m128 _w = _mm_loadu_ps(kptr);
                            _sum = _mm_add_ps(_mm_mul_ps(_val, _w), _sum);

                            sptr += dilation_w;
                            kptr += 4;
                        }
                    }

                    _sum = activation_sse(_sum, activation_type, activation_params);

                    _mm_storeu_ps(outptr, _sum);
                    outptr += 4;
                }
            }
        }
    }

    if (elempack == 4 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = weight_data_packed.channel(p);

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w * 4;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            __m128 _val = _mm_loadu_ps(sptr);
                            __m128 _w = _mm_loadu_ps(kptr);
                            __m128 _s4 = _mm_mul_ps(_val, _w);
                            sum += _mm_reduce_add_ps(_s4); // dot

                            sptr += dilation_w * 4;
                            kptr += 4;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }
#endif // __SSE2__

    if (elempack == 1 && out_elempack == 1)
    {
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < outh; p++)
            {
                float* outptr = top_blob.row(p);

                for (int j = 0; j < outw; j++)
                {
                    float sum = 0.f;

                    if (bias_term)
                    {
                        sum = bias_data[p];
                    }

                    const float* kptr = (const float*)weight_data + kernel_w * h * p;

                    for (int q = 0; q < h; q++)
                    {
                        const float* sptr = bottom_blob_bordered.row(q) + j * stride_w;

                        for (int k = 0; k < kernel_w; k++)
                        {
                            float val = sptr[0];
                            float wt = kptr[0];
                            sum += val * wt;

                            sptr += dilation_w;
                            kptr += 1;
                        }
                    }

                    sum = activation_ss(sum, activation_type, activation_params);

                    outptr[j] = sum;
                }
            }
        }
    }

    return 0;
}